

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_sah.cpp
# Opt level: O1

Builder * embree::avx::BVH8VirtualSceneBuilderSAH(void *bvh,Scene *scene,size_t mode)

{
  int iVar1;
  uint uVar2;
  long lVar3;
  Builder *pBVar4;
  __int_type_conflict _Var5;
  _func_int **pp_Var6;
  _func_int **pp_Var7;
  
  lVar3 = *(long *)&(scene->super_AccelN).field_0x188;
  iVar1 = *(int *)(lVar3 + 0x350);
  uVar2 = *(uint *)(lVar3 + 0x354);
  pBVar4 = (Builder *)operator_new(0xa8);
  (pBVar4->super_RefCount).refCounter.super___atomic_base<unsigned_long>._M_i = 0;
  (pBVar4->super_RefCount)._vptr_RefCount = (_func_int **)&PTR__BVHNBuilderSAH_022136e8;
  pBVar4[1].super_RefCount._vptr_RefCount = (_func_int **)bvh;
  pBVar4[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i =
       (__int_type_conflict)scene;
  pBVar4[2].super_RefCount._vptr_RefCount = (_func_int **)0x0;
  _Var5 = lVar3 + 0x550;
  if (lVar3 == 0) {
    _Var5 = 0;
  }
  pBVar4[2].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i = _Var5;
  pp_Var6 = (_func_int **)0x7;
  if (uVar2 < 7) {
    pp_Var6 = (_func_int **)(ulong)uVar2;
  }
  *(undefined1 *)&pBVar4[3].super_RefCount._vptr_RefCount = 0;
  pBVar4[3].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i = 0;
  pBVar4[4].super_RefCount._vptr_RefCount = (_func_int **)0x0;
  pBVar4[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i = 0;
  pBVar4[5].super_RefCount._vptr_RefCount = (_func_int **)0x2;
  pBVar4[5].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i = 0x20;
  for (pp_Var7 = (_func_int **)0x3f; 8UL >> (long)pp_Var7 == 0;
      pp_Var7 = (_func_int **)((long)pp_Var7 + -1)) {
  }
  pBVar4[6].super_RefCount._vptr_RefCount = pp_Var7;
  pp_Var7 = (_func_int **)(long)iVar1;
  if (pp_Var6 <= (_func_int **)(long)iVar1) {
    pp_Var7 = pp_Var6;
  }
  pBVar4[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i =
       (__int_type_conflict)pp_Var7;
  pBVar4[7].super_RefCount._vptr_RefCount = pp_Var6;
  pBVar4[7].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i =
       (__int_type_conflict)&DAT_3f8000003f800000;
  pBVar4[8].super_RefCount._vptr_RefCount = (_func_int **)0x400;
  pBVar4[8].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i = 0xffffffffffffffff;
  pBVar4[9].super_RefCount._vptr_RefCount = (_func_int **)0x20000000;
  *(undefined4 *)&pBVar4[9].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i =
       0xffffffff;
  *(undefined1 *)
   ((long)&pBVar4[9].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i + 4) = 0;
  *(undefined4 *)&pBVar4[10].super_RefCount._vptr_RefCount = 0;
  return pBVar4;
}

Assistant:

Builder* BVH8VirtualSceneBuilderSAH    (void* bvh, Scene* scene, size_t mode) {
      int minLeafSize = scene->device->object_accel_min_leaf_size;
      int maxLeafSize = scene->device->object_accel_max_leaf_size;
      return new BVHNBuilderSAH<8,Object>((BVH8*)bvh,scene,8,1.0f,minLeafSize,maxLeafSize,UserGeometry::geom_type);
    }